

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O2

string * __thiscall
flatbuffers::(anonymous_namespace)::GenerateTypeString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryRegion *region)

{
  unsigned_long __val;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  switch(*(undefined4 *)(this + 0x10)) {
  case 0:
    __s = "?uint8_t";
    break;
  case 1:
    __s = "UOffset32";
    break;
  case 2:
    __s = "SOffset32";
    break;
  case 3:
    __s = "VOffset16";
    break;
  case 4:
    __s = "bool";
    break;
  case 5:
  case 8:
    __s = "int8_t";
    break;
  case 6:
    __s = "char";
    break;
  case 7:
    __s = "uint8_t";
    break;
  case 9:
    __s = "uint16_t";
    break;
  case 10:
    __s = "int16_t";
    break;
  case 0xb:
    __s = "uint32_t";
    break;
  case 0xc:
    __s = "int32_t";
    break;
  case 0xd:
    __s = "uint64_t";
    break;
  case 0xe:
    __s = "int64_t";
    break;
  case 0xf:
    __s = "float";
    break;
  case 0x10:
    __s = "double";
    break;
  case 0x11:
    __s = "UType8";
    break;
  case 0x12:
    __s = "UOffset64";
    break;
  default:
    __s = "todo";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,__s,(allocator<char> *)&local_90);
  __val = *(unsigned_long *)(this + 0x18);
  if (__val == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"",(allocator<char> *)&local_50);
  }
  else {
    std::__cxx11::to_string(&local_30,__val);
    std::operator+(&local_50,"[",&local_30);
    std::operator+(&local_90,&local_50,"]");
  }
  std::operator+(__return_storage_ptr__,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (__val != 0) {
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenerateTypeString(const BinaryRegion &region) {
  return ToString(region.type) +
         ((region.array_length)
              ? "[" + std::to_string(region.array_length) + "]"
              : "");
}